

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O0

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  int iVar1;
  undefined8 *in_RSI;
  long in_RDI;
  uchar keydata [64];
  secp256k1_rfc6979_hmac_sha256 rng;
  uchar nonce32 [32];
  secp256k1_fe s;
  secp256k1_gej gb;
  secp256k1_scalar b;
  secp256k1_gej *in_stack_fffffffffffffe78;
  secp256k1_gej *in_stack_fffffffffffffe80;
  secp256k1_scalar *in_stack_fffffffffffffe88;
  secp256k1_scalar *in_stack_fffffffffffffe90;
  secp256k1_fe *s_00;
  secp256k1_gej *r;
  uchar local_f8 [56];
  size_t in_stack_ffffffffffffff40;
  uchar *in_stack_ffffffffffffff48;
  secp256k1_rfc6979_hmac_sha256 *in_stack_ffffffffffffff50;
  secp256k1_gej *in_stack_ffffffffffffff58;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffff60;
  secp256k1_scalar local_30;
  undefined8 *local_10;
  long local_8;
  
  local_8 = in_RDI;
  if (in_RSI == (undefined8 *)0x0) {
    secp256k1_gej_set_ge(in_stack_fffffffffffffe80,(secp256k1_ge *)in_stack_fffffffffffffe78);
    secp256k1_gej_neg(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    secp256k1_scalar_set_int((secp256k1_scalar *)(local_8 + 8),1);
  }
  else {
    local_10 = in_RSI;
    secp256k1_scalar_get_b32
              ((uchar *)in_stack_fffffffffffffe80,(secp256k1_scalar *)in_stack_fffffffffffffe78);
    s_00 = (secp256k1_fe *)*local_10;
    r = (secp256k1_gej *)local_10[1];
    secp256k1_rfc6979_hmac_sha256_initialize
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    memset(&stack0xfffffffffffffe78,0,0x40);
    secp256k1_rfc6979_hmac_sha256_generate
              ((secp256k1_rfc6979_hmac_sha256 *)keydata._48_8_,(uchar *)keydata._40_8_,
               keydata._32_8_);
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)(local_f8 + 0x20),local_f8);
    iVar1 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)(local_f8 + 0x20));
    secp256k1_fe_impl_cmov((secp256k1_fe *)(local_f8 + 0x20),&secp256k1_fe_one,iVar1);
    secp256k1_gej_rescale(r,s_00);
    secp256k1_fe_impl_clear((secp256k1_fe *)(local_f8 + 0x20));
    secp256k1_rfc6979_hmac_sha256_generate
              ((secp256k1_rfc6979_hmac_sha256 *)keydata._48_8_,(uchar *)keydata._40_8_,
               keydata._32_8_);
    secp256k1_scalar_set_b32
              (in_stack_fffffffffffffe90,(uchar *)in_stack_fffffffffffffe88,
               (int *)in_stack_fffffffffffffe80);
    iVar1 = secp256k1_scalar_is_zero(&local_30);
    secp256k1_scalar_cmov(&local_30,&secp256k1_scalar_one,iVar1);
    secp256k1_rfc6979_hmac_sha256_finalize((secp256k1_rfc6979_hmac_sha256 *)0x104cb4);
    memset(local_f8,0,0x20);
    secp256k1_ecmult_gen
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (secp256k1_scalar *)in_stack_ffffffffffffff50);
    secp256k1_scalar_negate(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    *(uint64_t *)(local_8 + 8) = local_30.d[0];
    *(uint64_t *)(local_8 + 0x10) = local_30.d[1];
    *(uint64_t *)(local_8 + 0x18) = local_30.d[2];
    *(uint64_t *)(local_8 + 0x20) = local_30.d[3];
    memcpy((void *)(local_8 + 0x28),&stack0xffffffffffffff50,0x80);
    secp256k1_scalar_clear(&local_30);
    secp256k1_gej_clear((secp256k1_gej *)0x104d65);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_gej gb;
    secp256k1_fe s;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char keydata[64];
    if (seed32 == NULL) {
        /* When seed is NULL, reset the initial point and blinding value. */
        secp256k1_gej_set_ge(&ctx->initial, &secp256k1_ge_const_g);
        secp256k1_gej_neg(&ctx->initial, &ctx->initial);
        secp256k1_scalar_set_int(&ctx->blind, 1);
        return;
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(keydata, &ctx->blind);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    VERIFY_CHECK(seed32 != NULL);
    memcpy(keydata + 32, seed32, 32);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, 64);
    memset(keydata, 0, sizeof(keydata));
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_fe_set_b32_mod(&s, nonce32);
    secp256k1_fe_cmov(&s, &secp256k1_fe_one, secp256k1_fe_normalizes_to_zero(&s));
    /* Randomize the projection to defend against multiplier sidechannels.
       Do this before our own call to secp256k1_ecmult_gen below. */
    secp256k1_gej_rescale(&ctx->initial, &s);
    secp256k1_fe_clear(&s);
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* A blinding value of 0 works, but would undermine the projection hardening. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    memset(nonce32, 0, 32);
    /* The random projection in ctx->initial ensures that gb will have a random projection. */
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    ctx->blind = b;
    ctx->initial = gb;
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
}